

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<double,_ft::allocator<double>_>::pop_back(list<double,_ft::allocator<double>_> *this)

{
  pointer p;
  listNode<double> *plVar1;
  node *pnVar2;
  node *pnVar3;
  node *delNode;
  list<double,_ft::allocator<double>_> *this_local;
  
  pnVar2 = tail(this);
  p = pnVar2->prev;
  plVar1 = p->prev;
  pnVar2 = tail(this);
  pnVar2->prev = plVar1;
  pnVar2 = tail(this);
  pnVar3 = tail(this);
  pnVar3->prev->next = pnVar2;
  allocator<ft::listNode<double>_>::destroy((allocator<ft::listNode<double>_> *)&this->field_0x18,p)
  ;
  allocator<ft::listNode<double>_>::deallocate
            ((allocator<ft::listNode<double>_> *)&this->field_0x18,p,1);
  this->m_size = this->m_size - 1;
  return;
}

Assistant:

void pop_back() {
		node*	delNode = this->tail()->prev;
		this->tail()->prev = delNode->prev;
		this->tail()->prev->next = this->tail();
		this->m_alloc.destroy(delNode);
		this->m_alloc.deallocate(delNode, 1);
		--this->m_size;
	}